

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_test.cpp
# Opt level: O0

void just_test_test_case_f_test_two_vectors_can_be_compared(void)

{
  pointer *a_;
  allocator<char> local_e1;
  string local_e0;
  assert_equal_container local_c0;
  allocator<char> local_81;
  string local_80;
  assert_equal_container local_60;
  undefined1 local_38 [8];
  vector<double,_std::allocator<double>_> vd;
  vector<int,_std::allocator<int>_> vi;
  
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &vd.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/test/test/test_test.cpp"
             ,&local_81);
  just::test::assert_equal_container::assert_equal_container(&local_60,&local_80,0xf);
  a_ = &vd.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage;
  just::test::assert_equal_container::operator()
            (&local_60,(vector<int,_std::allocator<int>_> *)a_,
             (vector<int,_std::allocator<int>_> *)a_);
  just::test::assert_equal_container::~assert_equal_container(&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/test/test/test_test.cpp"
             ,&local_e1);
  just::test::assert_equal_container::assert_equal_container(&local_c0,&local_e0,0x10);
  just::test::assert_equal_container::operator()
            (&local_c0,
             (vector<int,_std::allocator<int>_> *)
             &vd.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,(vector<double,_std::allocator<double>_> *)local_38);
  just::test::assert_equal_container::~assert_equal_container(&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_38);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &vd.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage);
  return;
}

Assistant:

JUST_TEST_CASE(test_two_vectors_can_be_compared)
{
  std::vector<int> vi;
  std::vector<double> vd;

  JUST_ASSERT_EQUAL_CONTAINER(vi, vi);
  JUST_ASSERT_EQUAL_CONTAINER(vi, vd);
}